

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

Vec_Int_t * Abc_NtkCollectCiCones(Abc_Ntk_t *pNtk,int fVerbose)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  abctime aVar6;
  Vec_Ptr_t *p;
  Vec_Int_t *vArr;
  Vec_Int_t *p_00;
  Vec_Wec_t *p_01;
  Abc_Obj_t *pAVar7;
  Vec_Int_t *vArr1;
  Vec_Int_t *pVVar8;
  abctime aVar9;
  Vec_Int_t t;
  Vec_Wec_t *vSupps;
  Vec_Int_t *vSuppsCi;
  Vec_Int_t *vTemp;
  Vec_Int_t *vFanout;
  Vec_Int_t *vFanin;
  Vec_Ptr_t *vNodes;
  int k;
  int i;
  Abc_Obj_t *pNode;
  abctime clk;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar6 = Abc_Clock();
  p = Abc_NtkDfs(pNtk,0);
  vArr = Vec_IntAlloc(0);
  iVar4 = Abc_NtkCiNum(pNtk);
  p_00 = Vec_IntAlloc(iVar4);
  iVar4 = Abc_NtkObjNumMax(pNtk);
  p_01 = Vec_WecStart(iVar4);
  vNodes._4_4_ = Vec_PtrSize(p);
  while (vNodes._4_4_ = vNodes._4_4_ + -1, -1 < vNodes._4_4_) {
    pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p,vNodes._4_4_);
    uVar5 = Abc_ObjId(pAVar7);
    pVVar8 = Vec_WecEntry(p_01,uVar5);
    Vec_IntPush(pVVar8,vNodes._4_4_);
    for (vNodes._0_4_ = 0; iVar4 = Abc_ObjFaninNum(pAVar7), (int)vNodes < iVar4;
        vNodes._0_4_ = (int)vNodes + 1) {
      iVar4 = Abc_ObjFaninId(pAVar7,(int)vNodes);
      vArr1 = Vec_WecEntry(p_01,iVar4);
      Vec_IntTwoMerge2(vArr1,pVVar8,vArr);
      iVar2 = vArr1->nCap;
      iVar3 = vArr1->nSize;
      piVar1 = vArr1->pArray;
      iVar4 = vArr->nSize;
      vArr1->nCap = vArr->nCap;
      vArr1->nSize = iVar4;
      vArr1->pArray = vArr->pArray;
      vArr->nCap = iVar2;
      vArr->nSize = iVar3;
      vArr->pArray = piVar1;
    }
  }
  for (vNodes._4_4_ = 0; iVar4 = Abc_NtkCiNum(pNtk), vNodes._4_4_ < iVar4;
      vNodes._4_4_ = vNodes._4_4_ + 1) {
    pAVar7 = Abc_NtkCi(pNtk,vNodes._4_4_);
    uVar5 = Abc_ObjId(pAVar7);
    pVVar8 = Vec_WecEntry(p_01,uVar5);
    iVar4 = Vec_IntSize(pVVar8);
    Vec_IntPush(p_00,iVar4);
  }
  Vec_WecFree(p_01);
  Vec_PtrFree(p);
  Vec_IntFree(vArr);
  if (fVerbose != 0) {
    aVar9 = Abc_Clock();
    Abc_PrintTime(1,"Output cone computation",aVar9 - aVar6);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCiCones( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCi = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        Vec_IntPush( vFanout, i );
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
            ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
        }
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( vSuppsCi, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjId(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Output cone computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCi );
    return vSuppsCi;
}